

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

void bb_uses(dill_stream c,basic_block_conflict bb,int vreg)

{
  char *pcVar1;
  anon_struct_4_2_0bc3ac41_for_use_info *paVar2;
  int index;
  int mask;
  uint uVar3;
  
  if (99 < vreg) {
    uVar3 = vreg - 100;
    if (((byte)bb->regs_defined->vec[uVar3 >> 3] >> (uVar3 & 7) & 1) == 0) {
      pcVar1 = bb->regs_used->vec + (uVar3 >> 3);
      *pcVar1 = *pcVar1 | (byte)(1 << ((byte)uVar3 & 7));
    }
    paVar2 = &c->p->vregs[(ulong)(uint)vreg - 100].use_info;
    paVar2->use_count = paVar2->use_count + 1;
  }
  return;
}

Assistant:

static void
bb_uses(dill_stream c, basic_block bb, int vreg)
{
    if (vreg >= 100) {
        /* not param */
        if (!bit_vec_is_set(bb->regs_defined, vreg - 100)) {
            bit_vec_set(bb->regs_used, vreg - 100);
        }
        set_used(c, vreg);
    }
}